

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O3

void __thiscall
cmsys::SystemInformationImplementation::TrimNewline
          (SystemInformationImplementation *this,string *output)

{
  ulong uVar1;
  size_t sVar2;
  void *__ptr;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  int iStack_74;
  long *plStack_70;
  char *pcStack_68;
  long alStack_60 [2];
  undefined8 uStack_50;
  string *psStack_48;
  
  for (uVar1 = std::__cxx11::string::find((char *)output,0x5050af,0); uVar1 != 0xffffffffffffffff;
      uVar1 = std::__cxx11::string::find((char *)output,0x5050af,uVar1)) {
    if (output->_M_string_length < uVar1) goto LAB_0043e887;
    output->_M_string_length = uVar1;
    (output->_M_dataplus)._M_p[uVar1] = '\0';
  }
  uVar1 = std::__cxx11::string::find((char *)output,0x537ec9,0);
  while( true ) {
    if (uVar1 == 0xffffffffffffffff) {
      return;
    }
    if (output->_M_string_length < uVar1) break;
    output->_M_string_length = uVar1;
    (output->_M_dataplus)._M_p[uVar1] = '\0';
    uVar1 = std::__cxx11::string::find((char *)output,0x537ec9,uVar1);
  }
LAB_0043e887:
  pcVar5 = "%s: __pos (which is %zu) > this->size() (which is %zu)";
  pcVar4 = "basic_string::erase";
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",uVar1);
  pcVar3 = "???";
  if (pcVar4 != (char *)0x0) {
    pcVar3 = pcVar4;
  }
  plStack_70 = alStack_60;
  psStack_48 = output;
  sVar2 = strlen(pcVar3);
  std::__cxx11::string::_M_construct<char_const*>((string *)&plStack_70,pcVar3,pcVar3 + sVar2);
  iStack_74 = 0;
  uStack_50 = 0x400;
  __ptr = malloc(0x400);
  pcVar3 = (char *)__cxa_demangle(pcVar4,__ptr,&uStack_50,&iStack_74);
  if (iStack_74 == 0) {
    strlen(pcVar3);
    std::__cxx11::string::_M_replace((ulong)&plStack_70,0,pcStack_68,(ulong)pcVar3);
  }
  free(__ptr);
  std::__cxx11::string::operator=((string *)(pcVar5 + 0x50),(string *)&plStack_70);
  if (plStack_70 != alStack_60) {
    operator_delete(plStack_70,alStack_60[0] + 1);
  }
  return;
}

Assistant:

void SystemInformationImplementation::TrimNewline(kwsys_stl::string& output)
{
  // remove \r
  kwsys_stl::string::size_type pos=0;
  while((pos = output.find("\r", pos)) != kwsys_stl::string::npos)
    {
    output.erase(pos);
    }

  // remove \n
  pos = 0;
  while((pos = output.find("\n", pos)) != kwsys_stl::string::npos)
    {
    output.erase(pos);
    }
}